

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChEllipsoidShape.cpp
# Opt level: O1

void __thiscall chrono::ChEllipsoidShape::ChEllipsoidShape(ChEllipsoidShape *this)

{
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChEllipsoidShape_00b68650;
  (this->gellipsoid).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b65178;
  (this->gellipsoid).rad.m_data[0] = 0.0;
  (this->gellipsoid).rad.m_data[1] = 0.0;
  (this->gellipsoid).rad.m_data[2] = 0.0;
  (this->super_ChVisualShape).is_mutable = false;
  return;
}

Assistant:

ChEllipsoidShape::ChEllipsoidShape() {
    SetMutable(false);
}